

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void duckdb::GetReservoirQuantileDecimalFunction
               (AggregateFunctionSet *set,vector<duckdb::LogicalType,_true> *arguments,
               LogicalType *return_value)

{
  long lVar1;
  vector<duckdb::AggregateFunction,_true> *this;
  undefined8 *puVar2;
  aggregate_size_t *pp_Var3;
  byte bVar4;
  AggregateFunction fun;
  undefined1 local_3c0 [144];
  LogicalType LStack_330;
  FunctionStability local_318;
  FunctionNullHandling FStack_317;
  FunctionErrors FStack_316;
  FunctionCollationHandling FStack_315;
  undefined8 auStack_310 [11];
  code *local_2b8;
  code *local_2b0;
  AggregateOrderDependent local_2a8;
  AggregateDistinctDependent AStack_2a7;
  element_type *local_2a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  bVar4 = 0;
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)local_3c0,arguments,return_value,(aggregate_size_t)0x0,
             (aggregate_initialize_t)0x0,(aggregate_update_t)0x0,(aggregate_combine_t)0x0,
             (aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,BindReservoirQuantileDecimal,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  local_2b8 = ReservoirQuantileBindData::Serialize;
  local_2b0 = ReservoirQuantileBindData::Deserialize;
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_290,(SimpleFunction *)local_3c0);
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02433130;
  LogicalType::LogicalType(&local_290.super_BaseScalarFunction.return_type,&LStack_330);
  local_290.super_BaseScalarFunction.stability = local_318;
  local_290.super_BaseScalarFunction.null_handling = FStack_317;
  local_290.super_BaseScalarFunction.errors = FStack_316;
  local_290.super_BaseScalarFunction.collation_handling = FStack_315;
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02435ff8;
  puVar2 = auStack_310;
  pp_Var3 = &local_290.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_290.order_dependent = local_2a8;
  local_290.distinct_dependent = AStack_2a7;
  local_290.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2a0;
  local_290.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_298._M_pi;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
    }
  }
  this = &(set->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_290);
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02435ff8;
  if (local_290.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_290.super_BaseScalarFunction);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_3c0 + 0x48),
             &LogicalType::INTEGER);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_160,(SimpleFunction *)local_3c0);
  local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02433130;
  LogicalType::LogicalType(&local_160.super_BaseScalarFunction.return_type,&LStack_330);
  local_160.super_BaseScalarFunction.stability = local_318;
  local_160.super_BaseScalarFunction.null_handling = FStack_317;
  local_160.super_BaseScalarFunction.errors = FStack_316;
  local_160.super_BaseScalarFunction.collation_handling = FStack_315;
  local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02435ff8;
  puVar2 = auStack_310;
  pp_Var3 = &local_160.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_160.order_dependent = local_2a8;
  local_160.distinct_dependent = AStack_2a7;
  local_160.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2a0;
  local_160.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_298._M_pi;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_160);
  local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02435ff8;
  if (local_160.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
  local_3c0._0_8_ = &PTR__AggregateFunction_02435ff8;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3c0);
  return;
}

Assistant:

static void GetReservoirQuantileDecimalFunction(AggregateFunctionSet &set, const vector<LogicalType> &arguments,
                                                const LogicalType &return_value) {
	AggregateFunction fun(arguments, return_value, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                      BindReservoirQuantileDecimal);
	fun.serialize = ReservoirQuantileBindData::Serialize;
	fun.deserialize = ReservoirQuantileBindData::Deserialize;
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);
}